

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_file_sink-inl.h
# Opt level: O0

filename_t * __thiscall
spdlog::sinks::rotating_file_sink<std::mutex>::filename_abi_cxx11_
          (rotating_file_sink<std::mutex> *this)

{
  long in_RSI;
  filename_t *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  filename_t *__str;
  
  __str = in_RDI;
  CLI::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffffb8);
  details::file_helper::filename_abi_cxx11_((file_helper *)(in_RSI + 0x78));
  std::__cxx11::string::string(unaff_retaddr,__str);
  CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x6e228a);
  return in_RDI;
}

Assistant:

SPDLOG_INLINE filename_t rotating_file_sink<Mutex>::filename() {
    std::lock_guard<Mutex> lock(base_sink<Mutex>::mutex_);
    return file_helper_.filename();
}